

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Relooper.cpp
# Opt level: O0

bool __thiscall
CFG::anon_unknown_11::Optimizer::HaveEquivalentContents(Optimizer *this,Block *A,Block *B)

{
  Branch *pBVar1;
  bool bVar2;
  size_t sVar3;
  size_t sVar4;
  reference __in;
  type *k;
  type *ppBVar5;
  Branch **ppBVar6;
  Branch *BBranch;
  type *ABranch;
  type *ABlock;
  _Self local_40;
  iterator __end2;
  iterator __begin2;
  BlockBranchMap *__range2;
  Block *B_local;
  Block *A_local;
  Optimizer *this_local;
  
  bVar2 = IsPossibleCodeEquivalent(A->SwitchCondition,B->SwitchCondition);
  if (bVar2) {
    bVar2 = IsCodeEquivalent(A->Code,B->Code);
    if (bVar2) {
      sVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::size(&A->BranchesOut);
      sVar4 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::size(&B->BranchesOut);
      if (sVar3 == sVar4) {
        __end2 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::begin(&A->BranchesOut);
        local_40._M_node =
             (_List_node_base *)
             ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::end(&A->BranchesOut);
        while (bVar2 = std::operator!=(&__end2,&local_40), bVar2) {
          __in = std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator*
                           (&__end2);
          k = std::get<0ul,CFG::Block*const,CFG::Branch*>(__in);
          ppBVar5 = std::get<1ul,CFG::Block*const,CFG::Branch*>(__in);
          sVar3 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::count(&B->BranchesOut,k);
          if (sVar3 == 0) {
            return false;
          }
          ppBVar6 = ::wasm::InsertOrderedMap<CFG::Block_*,_CFG::Branch_*>::operator[]
                              (&B->BranchesOut,k);
          pBVar1 = *ppBVar6;
          bVar2 = IsPossibleCodeEquivalent((*ppBVar5)->Condition,pBVar1->Condition);
          if (!bVar2) {
            return false;
          }
          bVar2 = CFG::(anonymous_namespace)::Optimizer::
                  IsPossibleUniquePtrEquivalent<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                            (&(*ppBVar5)->SwitchValues,&pBVar1->SwitchValues);
          if (!bVar2) {
            return false;
          }
          bVar2 = IsPossibleCodeEquivalent((*ppBVar5)->Code,pBVar1->Code);
          if (!bVar2) {
            return false;
          }
          std::_List_iterator<std::pair<CFG::Block_*const,_CFG::Branch_*>_>::operator++(&__end2);
        }
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool HaveEquivalentContents(Block* A, Block* B) {
    if (!IsPossibleCodeEquivalent(A->SwitchCondition, B->SwitchCondition)) {
      return false;
    }
    if (!IsCodeEquivalent(A->Code, B->Code)) {
      return false;
    }
    if (A->BranchesOut.size() != B->BranchesOut.size()) {
      return false;
    }
    for (auto& [ABlock, ABranch] : A->BranchesOut) {
      if (B->BranchesOut.count(ABlock) == 0) {
        return false;
      }
      auto* BBranch = B->BranchesOut[ABlock];
      if (!IsPossibleCodeEquivalent(ABranch->Condition, BBranch->Condition)) {
        return false;
      }
      if (!IsPossibleUniquePtrEquivalent(ABranch->SwitchValues,
                                         BBranch->SwitchValues)) {
        return false;
      }
      if (!IsPossibleCodeEquivalent(ABranch->Code, BBranch->Code)) {
        return false;
      }
    }
    return true;
  }